

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index,int var_index,
          ComplInfo info)

{
  size_type sVar1;
  reference pvVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar4;
  AlgebraicConInfo *con;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  ComplInfo local_4;
  
  this_00 = in_RDI;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &in_RDI[0x1a].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar1 <= (ulong)(long)in_ESI) {
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
    ::capacity((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                *)(in_RDI + 0x17));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_00,CONCAT44(in_ESI,in_EDX));
    std::
    vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
    ::size((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
            *)(in_RDI + 0x17));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (in_stack_ffffffffffffffe0,(size_type)in_RDI);
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                      &in_RDI[0x1a].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(long)in_ESI);
  *pvVar2 = in_EDX + 1;
  pvVar3 = std::
           vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
           ::operator[]((vector<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                         *)(in_RDI + 0x17),(long)in_ESI);
  dVar4 = ComplInfo::con_lb(&local_4);
  pvVar3->lb = dVar4;
  dVar4 = ComplInfo::con_ub(&local_4);
  pvVar3->ub = dVar4;
  return;
}

Assistant:

void BasicProblem<Alloc>::SetComplementarity(
    int con_index, int var_index, ComplInfo info) {
  MP_ASSERT(0 <= con_index && con_index < num_algebraic_cons(),
            "invalid index");
  MP_ASSERT(0 <= var_index && var_index < num_vars(), "invalid index");
  if (compl_vars_.size() <= static_cast<std::size_t>(con_index)) {
    compl_vars_.reserve(algebraic_cons_.capacity());
    compl_vars_.resize(algebraic_cons_.size());
  }
  compl_vars_[con_index] = var_index + 1u;
  AlgebraicConInfo &con = algebraic_cons_[con_index];
  con.lb = info.con_lb();
  con.ub = info.con_ub();
}